

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_oct
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  uint uVar1;
  basic_format_specs<char> *specs;
  anon_class_16_2_cb75083a_for_f f;
  int num_digits;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  string_view prefix;
  undefined4 uStack_c;
  
  num_digits = count_digits<3u,unsigned_int>(this->abs_value);
  specs = this->specs;
  if ((((char)specs->field_0x9 < '\0') && (specs->precision <= num_digits)) &&
     (this->abs_value != 0)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar2 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_oct()::_lambda(char*)_1_>
                    ((this->out).container,num_digits,prefix,specs,f);
  (this->out).container = bVar2.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }